

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

void __thiscall nuraft::inmem_log_store::disk_emul_loop(inmem_log_store *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  uint64_t uVar3;
  iterator __position;
  bool bVar4;
  size_t time_us;
  lock_guard<std::mutex> l;
  
  p_Var1 = &(this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header;
  time_us = 100000;
  while( true ) {
    if (((this->disk_emul_thread_stop_signal_)._M_base._M_i & 1U) != 0) {
      return;
    }
    EventAwaiter::wait_us(&this->disk_emul_ea_,time_us);
    LOCK();
    (this->disk_emul_ea_).status._M_i = idle;
    UNLOCK();
    if (((this->disk_emul_thread_stop_signal_)._M_base._M_i & 1U) != 0) break;
    uVar3 = timer_helper::get_timeofday_us();
    std::mutex::lock(&this->logs_lock_);
    bVar4 = false;
    for (__position._M_node =
              (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
        ((_Rb_tree_header *)__position._M_node != p_Var1 &&
        (*(ulong *)(__position._M_node + 1) <= uVar3));
        __position = std::
                     _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                     ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                                         *)&this->disk_emul_logs_being_written_,__position)) {
      LOCK();
      (this->disk_emul_last_durable_index_).super___atomic_base<unsigned_long>._M_i =
           (__int_type)__position._M_node[1]._M_parent;
      UNLOCK();
      bVar4 = true;
    }
    p_Var2 = (this->disk_emul_logs_being_written_)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    if ((_Rb_tree_header *)p_Var2 == p_Var1) {
      time_us = 100000;
    }
    else {
      time_us = *(long *)(p_Var2 + 1) - uVar3;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    if (bVar4) {
      raft_server::notify_log_append_completion(this->raft_server_bwd_pointer_,true);
    }
  }
  return;
}

Assistant:

void inmem_log_store::disk_emul_loop() {
    // This thread mimics async disk writes.

    size_t next_sleep_us = 100 * 1000;
    while (!disk_emul_thread_stop_signal_) {
        disk_emul_ea_.wait_us(next_sleep_us);
        disk_emul_ea_.reset();
        if (disk_emul_thread_stop_signal_) break;

        uint64_t cur_time = timer_helper::get_timeofday_us();
        next_sleep_us = 100 * 1000;

        bool call_notification = false;
        {
            std::lock_guard<std::mutex> l(logs_lock_);
            // Remove all timestamps equal to or smaller than `cur_time`,
            // and pick the greatest one among them.
            auto entry = disk_emul_logs_being_written_.begin();
            while (entry != disk_emul_logs_being_written_.end()) {
                if (entry->first <= cur_time) {
                    disk_emul_last_durable_index_ = entry->second;
                    entry = disk_emul_logs_being_written_.erase(entry);
                    call_notification = true;
                } else {
                    break;
                }
            }

            entry = disk_emul_logs_being_written_.begin();
            if (entry != disk_emul_logs_being_written_.end()) {
                next_sleep_us = entry->first - cur_time;
            }
        }

        if (call_notification) {
            raft_server_bwd_pointer_->notify_log_append_completion(true);
        }
    }
}